

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_set.cc
# Opt level: O0

void __thiscall sfm::FeatureSet::clear_descriptors(FeatureSet *this)

{
  FeatureSet *this_local;
  
  std::vector<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>::clear
            (&this->sift_descriptors);
  std::vector<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>::
  shrink_to_fit(&this->sift_descriptors);
  std::vector<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_>::clear
            (&this->surf_descriptors);
  std::vector<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_>::
  shrink_to_fit(&this->surf_descriptors);
  return;
}

Assistant:

void
FeatureSet::clear_descriptors (void)
{
    this->sift_descriptors.clear();
    this->sift_descriptors.shrink_to_fit();
    this->surf_descriptors.clear();
    this->surf_descriptors.shrink_to_fit();
}